

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void PPRF_Eval(long msg)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *ppuVar3;
  int local_24;
  _Node_iterator_base<std::pair<const_long,_unsigned_char_*>,_false> _Stack_20;
  int j;
  _Node_iterator_base<std::pair<const_long,_unsigned_char_*>,_false> local_18;
  long local_10;
  long msg_local;
  
  local_10 = msg;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_unsigned_char_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>_>
       ::find(&keys,&local_10);
  _Stack_20._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_unsigned_char_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>_>
       ::end(&keys);
  bVar1 = std::__detail::operator==(&local_18,&stack0xffffffffffffffe0);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"stop at punctured point !");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Original pseudo random value of  ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
    poVar2 = std::operator<<(poVar2," is : ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
      ppuVar3 = std::
                unordered_map<long,_unsigned_char_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>_>
                ::operator[](&keys,&local_10);
      printf("%02x ",(ulong)(*ppuVar3)[local_24]);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void PPRF_Eval(long msg ){
    if(keys.find(msg) == keys.end()){
        cout << "stop at punctured point !" << endl;
    }
    else{
        cout <<"Original pseudo random value of  "<< msg << " is : " << endl;
        for (int j = 0 ; j <16; ++j){
            printf ( "%02x ",keys[msg][j]);
        }
        cout << endl ;
    }
}